

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

void __thiscall
CVmObjClass::restore_from_file(CVmObjClass *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  vm_meta_entry_t *pvVar4;
  char b [2];
  char b_1 [2];
  char b_2 [4];
  char buf [5];
  ushort local_40;
  ushort local_3e;
  uint local_3c;
  char local_35 [5];
  uint *puVar3;
  
  puVar3 = (uint *)(this->super_CVmObject).ext_;
  if (puVar3 == (uint *)0x0) {
    iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x20,this);
    puVar3 = (uint *)CONCAT44(extraout_var,iVar2);
    (this->super_CVmObject).ext_ = (char *)puVar3;
  }
  CVmFile::read_bytes(fp,(char *)&local_40,2);
  CVmFile::read_bytes(fp,(char *)&local_3e,2);
  *puVar3 = (uint)local_3e;
  CVmFile::read_bytes(fp,(char *)&local_3c,4);
  puVar3[1] = local_3c;
  puVar3[2] = 1;
  if (0xc < (ulong)local_40) {
    CVmFile::read_bytes(fp,local_35,5);
    CVmObjFixup::fix_dh(fixups,local_35);
    ((vm_val_t *)(puVar3 + 2))->typ = (int)local_35[0];
    vmb_get_dh_val(local_35,(vm_val_t *)(puVar3 + 2));
  }
  if (0xd < local_40) {
    fseek((FILE *)fp->fp_,(ulong)local_40 - 0xd,1);
  }
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  if ((ulong)uVar1 < G_meta_table_X->count_) {
    pvVar4 = G_meta_table_X->table_ + (int)uVar1;
  }
  else {
    pvVar4 = (vm_meta_entry_t *)0x0;
  }
  if (pvVar4 != (vm_meta_entry_t *)0x0) {
    pvVar4->class_obj_ = self;
  }
  return;
}

Assistant:

void CVmObjClass::restore_from_file(VMG_ vm_obj_id_t self,
                                    CVmFile *fp, CVmObjFixup *fixups)
{
    /* allocate/reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* read the length */
    size_t len = fp->read_uint2();
    const size_t expected_len = 2+2+4+VMB_DATAHOLDER;

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = fp->read_uint2();
    ext->mod_obj = (vm_obj_id_t)fp->read_uint4();

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (len >= 2+2+4+VMB_DATAHOLDER)
    {
        char buf[VMB_DATAHOLDER];
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, &ext->class_state);
    }

    /* skip any extra data we don't recognize */
    if (len > expected_len)
        fp->set_pos_from_cur(len - expected_len);

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}